

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O3

VCameraInfo * __thiscall
ViconDataStreamSDK::Core::VClient::GetCamera(VClient *this,string *i_rCameraName,Enum *o_rResult)

{
  VCameraInfo *pVVar1;
  bool bVar2;
  VCameraInfo *pVVar3;
  Enum EVar4;
  long lVar5;
  long lVar6;
  __normal_iterator<const_ViconCGStream::VCameraInfo_*,_std::vector<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>_>
  __it;
  __normal_iterator<const_ViconCGStream::VCameraInfo_*,_std::vector<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>_>
  __it_00;
  scoped_lock Lock;
  string *local_58;
  VCameraInfo *local_50;
  Enum *local_48;
  unique_lock<boost::recursive_mutex> local_40;
  
  local_40.m = &this->m_FrameMutex;
  local_40.is_locked = false;
  local_48 = o_rResult;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_40);
  __it_00._M_current =
       (this->m_LatestFrame).m_Cameras.
       super__Vector_base<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_50 = (this->m_LatestFrame).m_Cameras.
             super__Vector_base<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)local_50 - (long)__it_00._M_current;
  lVar6 = (lVar5 >> 5) * -0x3333333333333333 >> 2;
  local_58 = i_rCameraName;
  if (0 < lVar6) {
    lVar6 = lVar6 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::$_0>
              ::operator()((_Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::__0>
                            *)&local_58,__it_00);
      __it._M_current = __it_00._M_current;
      if (bVar2) goto LAB_0012e461;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::$_0>
              ::operator()((_Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::__0>
                            *)&local_58,__it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      if (bVar2) goto LAB_0012e461;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::$_0>
              ::operator()((_Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::__0>
                            *)&local_58,__it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      if (bVar2) goto LAB_0012e461;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::$_0>
              ::operator()((_Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::__0>
                            *)&local_58,__it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      if (bVar2) goto LAB_0012e461;
      __it_00._M_current = __it_00._M_current + 4;
      lVar6 = lVar6 + -1;
      lVar5 = lVar5 + -0x280;
    } while (1 < lVar6);
  }
  lVar5 = (lVar5 >> 5) * -0x3333333333333333;
  if (lVar5 != 1) {
    __it._M_current = __it_00._M_current;
    if (lVar5 != 2) {
      __it._M_current = local_50;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::$_0>
                  ::operator()((_Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::__0>
                                *)&local_58,__it_00), __it._M_current = __it_00._M_current, bVar2))
      goto LAB_0012e461;
      __it._M_current = __it_00._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::$_0>
            ::operator()((_Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::__0>
                          *)&local_58,__it);
    if (bVar2) goto LAB_0012e461;
    __it_00._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::$_0>
          ::operator()((_Iter_pred<ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::__0>
                        *)&local_58,__it_00);
  __it._M_current = local_50;
  if (bVar2) {
    __it._M_current = __it_00._M_current;
  }
LAB_0012e461:
  pVVar1 = (this->m_LatestFrame).m_Cameras.
           super__Vector_base<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  EVar4 = Success;
  if (__it._M_current == pVVar1) {
    EVar4 = InvalidCameraName;
  }
  *local_48 = EVar4;
  if (local_40.is_locked != false) {
    boost::recursive_mutex::unlock(local_40.m);
  }
  pVVar3 = (VCameraInfo *)0x0;
  if (__it._M_current != pVVar1) {
    pVVar3 = __it._M_current;
  }
  return pVVar3;
}

Assistant:

const ViconCGStream::VCameraInfo * VClient::GetCamera( const std::string & i_rCameraName, Result::Enum & o_rResult ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  const auto rCameraIt = 
    std::find_if( m_LatestFrame.m_Cameras.begin(), m_LatestFrame.m_Cameras.end(),
      [&i_rCameraName]( const ViconCGStream::VCameraInfo & rCamera )
        { return AdaptCameraName( rCamera.m_Name, rCamera.m_DisplayType, rCamera.m_CameraID ) == i_rCameraName; }
    );

  if( rCameraIt != m_LatestFrame.m_Cameras.end() )
  {
    o_rResult = Result::Success;
    return &(*rCameraIt);
  }

  o_rResult = Result::InvalidCameraName;
  return nullptr;
}